

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void hang_tick(t_hang_conflict *h)

{
  t_atomtype tVar1;
  _pipe *object;
  int iVar2;
  t_hang_conflict *ptVar3;
  _hang_conflict *p_Var4;
  t_hang_conflict **pptVar5;
  _outlet **pp_Var6;
  int iVar7;
  word *pwVar8;
  
  object = h->h_owner;
  p_Var4 = object->x_hang;
  if (object->x_hang == h) {
    pptVar5 = &object->x_hang;
    p_Var4 = h;
  }
  else {
    do {
      ptVar3 = p_Var4;
      p_Var4 = ptVar3->h_next;
      if (p_Var4 == (_hang_conflict *)0x0) goto LAB_00190ff7;
    } while (p_Var4 != h);
    pptVar5 = &ptVar3->h_next;
  }
  *pptVar5 = p_Var4->h_next;
LAB_00190ff7:
  iVar7 = object->x_n;
  if (iVar7 != 0) {
    pwVar8 = h->h_vec + (iVar7 + -1);
    pp_Var6 = &object->x_vec[iVar7 + -1].p_outlet;
    do {
      tVar1 = (((t_pipeout *)(pp_Var6 + -2))->p_atom).a_type;
      if (tVar1 == A_POINTER) {
        iVar2 = gpointer_check(pwVar8->w_gpointer,1);
        if (iVar2 == 0) {
          pd_error(object,"pipe: stale pointer");
        }
        else {
          outlet_pointer(*pp_Var6,pwVar8->w_gpointer);
        }
      }
      else if (tVar1 == A_SYMBOL) {
        outlet_symbol(*pp_Var6,pwVar8->w_symbol);
      }
      else if (tVar1 == A_FLOAT) {
        outlet_float(*pp_Var6,pwVar8->w_float);
      }
      iVar7 = iVar7 + -1;
      pwVar8 = (word *)(&pwVar8->w_float + -2);
      pp_Var6 = pp_Var6 + -3;
    } while (iVar7 != 0);
  }
  hang_free(h);
  return;
}

Assistant:

static void hang_tick(t_hang *h)
{
    t_pipe *x = h->h_owner;
    t_hang *h2, *h3;
    t_pipeout *p;
    int i;
    union word *w;
    if (x->x_hang == h) x->x_hang = h->h_next;
    else for (h2 = x->x_hang; (h3 = h2->h_next); h2 = h3)
    {
        if (h3 == h)
        {
            h2->h_next = h3->h_next;
            break;
        }
    }
    for (i = x->x_n, p = x->x_vec + (x->x_n - 1), w = h->h_vec + (x->x_n - 1);
        i--; p--, w--)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: outlet_float(p->p_outlet, w->w_float); break;
        case A_SYMBOL: outlet_symbol(p->p_outlet, w->w_symbol); break;
        case A_POINTER:
            if (gpointer_check(w->w_gpointer, 1))
                outlet_pointer(p->p_outlet, w->w_gpointer);
            else pd_error(x, "pipe: stale pointer");
            break;
        default: break;
        }
    }
    hang_free(h);
}